

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O1

int KINSetJacTimesVecSysFn(void *kinmem,KINSysFn jtimesSysFn)

{
  int iVar1;
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KINMem local_20;
  KINLsMem local_18;
  
  local_20 = (KINMem)0x0;
  local_18 = (KINLsMem)0x0;
  iVar1 = kinLs_AccessLMem(kinmem,"KINSetJacTimesVecSysFn",&local_20,&local_18);
  if (iVar1 == 0) {
    if (local_18->jtimesDQ == 0) {
      iVar1 = -3;
      KINProcessError(local_20,-3,0x170,"KINSetJacTimesVecSysFn",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"Internal finite-difference Jacobian-vector product is disabled.");
    }
    else {
      if (jtimesSysFn == (KINSysFn)0x0) {
        local_18->jt_func = local_20->kin_func;
      }
      else {
        local_18->jt_func = jtimesSysFn;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int KINSetJacTimesVecSysFn(void* kinmem, KINSysFn jtimesSysFn)
{
  int retval;
  KINMem kin_mem     = NULL;
  KINLsMem kinls_mem = NULL;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* check if using internal finite difference approximation */
  if (!(kinls_mem->jtimesDQ))
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Internal finite-difference Jacobian-vector product is disabled.");
    return (KINLS_ILL_INPUT);
  }

  /* store function pointers for system function (NULL implies use kin_func) */
  if (jtimesSysFn != NULL) { kinls_mem->jt_func = jtimesSysFn; }
  else { kinls_mem->jt_func = kin_mem->kin_func; }

  return (KINLS_SUCCESS);
}